

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

cmSourceGroup * __thiscall
cmMakefile::FindSourceGroup
          (cmMakefile *this,string *source,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *groups)

{
  cmSourceGroup *pcVar1;
  cmSourceGroup *pcVar2;
  __normal_iterator<cmSourceGroup_*,_std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>_>
  __tmp;
  pointer this_00;
  
  this_00 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (this_00 ==
        (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      pcVar1 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        pcVar2 = (groups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        if (pcVar1 == pcVar2) {
          return pcVar2;
        }
        pcVar1 = pcVar1 + -1;
        pcVar2 = cmSourceGroup::MatchChildrenRegex(pcVar1,source);
      } while (pcVar2 == (cmSourceGroup *)0x0);
      return pcVar2;
    }
    this_00 = this_00 + -1;
    pcVar1 = cmSourceGroup::MatchChildrenFiles(this_00,source);
  } while (pcVar1 == (cmSourceGroup *)0x0);
  return pcVar1;
}

Assistant:

cmSourceGroup* cmMakefile::FindSourceGroup(
  const std::string& source, std::vector<cmSourceGroup>& groups) const
{
  // First search for a group that lists the file explicitly.
  for (std::vector<cmSourceGroup>::reverse_iterator sg = groups.rbegin();
       sg != groups.rend(); ++sg) {
    cmSourceGroup* result = sg->MatchChildrenFiles(source);
    if (result) {
      return result;
    }
  }

  // Now search for a group whose regex matches the file.
  for (std::vector<cmSourceGroup>::reverse_iterator sg = groups.rbegin();
       sg != groups.rend(); ++sg) {
    cmSourceGroup* result = sg->MatchChildrenRegex(source);
    if (result) {
      return result;
    }
  }

  // Shouldn't get here, but just in case, return the default group.
  return groups.data();
}